

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void addgrams(vw *all,size_t ngram,size_t skip_gram,features *fs,size_t initial_length,
             v_array<unsigned_long> *gram_mask,size_t skips)

{
  ulong uVar1;
  v_array<unsigned_long> *pvVar2;
  features *pfVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  long lVar7;
  v_array<unsigned_long> *this;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var8;
  element_type *peVar9;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  size_t in_RCX;
  size_t in_RDX;
  vw *in_RSI;
  features *in_R8;
  v_array<unsigned_long> *in_R9;
  size_t unaff_retaddr;
  size_t n_1;
  string feature_name;
  size_t n;
  uint64_t new_index;
  size_t i;
  size_t last;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe88;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  features *in_stack_fffffffffffffea0;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  ulong local_78;
  string local_70 [32];
  ulong local_50;
  unsigned_long local_48;
  v_array<unsigned_long> *local_40;
  v_array<unsigned_long> *in_stack_ffffffffffffffc8;
  features *fs_00;
  
  fs_00 = in_R8;
  if ((in_RSI == (vw *)0x0) &&
     (pfVar3 = (features *)v_array<unsigned_long>::last(in_R9), fs_00 = in_R8, pfVar3 < in_R8)) {
    uVar4 = v_array<unsigned_long>::last(in_R9);
    in_stack_ffffffffffffffc8 = (v_array<unsigned_long> *)((long)in_R8 - uVar4);
    for (local_40 = (v_array<unsigned_long> *)0x0; local_40 < in_stack_ffffffffffffffc8;
        local_40 = (v_array<unsigned_long> *)((long)&local_40->_begin + 1)) {
      puVar5 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(in_RCX + 0x20),(size_t)local_40);
      local_48 = *puVar5;
      for (local_50 = 1; uVar1 = local_50, sVar6 = v_array<unsigned_long>::size(in_R9),
          pvVar2 = local_40, uVar1 < sVar6; local_50 = local_50 + 1) {
        lVar7 = local_48 * 0x1aa5cfd;
        this = (v_array<unsigned_long> *)(in_RCX + 0x20);
        puVar5 = v_array<unsigned_long>::operator[](in_R9,local_50);
        puVar5 = v_array<unsigned_long>::operator[](this,(long)&pvVar2->_begin + *puVar5);
        local_48 = lVar7 + *puVar5;
      }
      features::push_back(in_stack_fffffffffffffea0,
                          (feature_value)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                          (feature_index)in_stack_fffffffffffffe90);
      sVar6 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(in_RCX + 0x40));
      if (sVar6 != 0) {
        p_Var8 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)(in_RCX + 0x40),(size_t)local_40)->
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar9 = std::
                 __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var8);
        std::__cxx11::string::string(local_70,(string *)&peVar9->second);
        for (local_78 = 1; uVar1 = local_78, sVar6 = v_array<unsigned_long>::size(in_R9),
            uVar1 < sVar6; local_78 = local_78 + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"^",&local_a9);
          std::__cxx11::string::operator+=(local_70,local_a8);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          pvVar2 = local_40;
          this_00 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RCX + 0x40);
          puVar5 = v_array<unsigned_long>::operator[](in_R9,local_78);
          p_Var8 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_00,(long)&pvVar2->_begin + *puVar5)->
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ;
          peVar9 = std::
                   __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ::get(p_Var8);
          std::__cxx11::string::string(local_d0,(string *)&peVar9->second);
          std::__cxx11::string::operator+=(local_70,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
        __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RCX + 0x40);
        this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x40);
        in_stack_fffffffffffffea0 =
             (features *)
             v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(in_RCX + 0x40),(size_t)local_40);
        std::
        __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::get((__shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               *)in_stack_fffffffffffffea0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (this_01,__x,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
        shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                  ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(in_stack_fffffffffffffe90,
                    (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe88);
        std::
        shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x2a6764);
        std::__cxx11::string::~string(local_70);
      }
    }
  }
  if (in_RSI != (vw *)0x0) {
    v_array<unsigned_long>::last(in_R9);
    v_array<unsigned_long>::push_back
              ((v_array<unsigned_long> *)in_stack_fffffffffffffe90,
               (unsigned_long *)in_stack_fffffffffffffe88);
    addgrams(in_RSI,in_RDX,in_RCX,fs_00,(size_t)in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
    v_array<unsigned_long>::pop(in_R9);
  }
  if ((in_RDX != 0) && (in_RSI != (vw *)0x0)) {
    addgrams(in_RSI,in_RDX,in_RCX,fs_00,(size_t)in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
  }
  return;
}

Assistant:

void addgrams(vw& all, size_t ngram, size_t skip_gram, features& fs, size_t initial_length, v_array<size_t>& gram_mask,
    size_t skips)
{
  if (ngram == 0 && gram_mask.last() < initial_length)
  {
    size_t last = initial_length - gram_mask.last();
    for (size_t i = 0; i < last; i++)
    {
      uint64_t new_index = fs.indicies[i];
      for (size_t n = 1; n < gram_mask.size(); n++)
        new_index = new_index * quadratic_constant + fs.indicies[i + gram_mask[n]];

      fs.push_back(1., new_index);
      if (fs.space_names.size() > 0)
      {
        string feature_name(fs.space_names[i].get()->second);
        for (size_t n = 1; n < gram_mask.size(); n++)
        {
          feature_name += string("^");
          feature_name += string(fs.space_names[i + gram_mask[n]].get()->second);
        }
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(fs.space_names[i].get()->first, feature_name)));
      }
    }
  }
  if (ngram > 0)
  {
    gram_mask.push_back(gram_mask.last() + 1 + skips);
    addgrams(all, ngram - 1, skip_gram, fs, initial_length, gram_mask, 0);
    gram_mask.pop();
  }
  if (skip_gram > 0 && ngram > 0)
    addgrams(all, ngram, skip_gram - 1, fs, initial_length, gram_mask, skips + 1);
}